

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O0

forward_list<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
 __thiscall
RenX::LadderDatabase::getPlayerEntriesAndIndexByPartName
          (LadderDatabase *this,string_view name,size_t max)

{
  size_t sVar1;
  long in_R8;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  Entry *local_70;
  Entry *itr_1;
  Entry *local_48;
  Entry *itr;
  size_t index;
  long local_30;
  size_t max_local;
  LadderDatabase *this_local;
  string_view name_local;
  forward_list<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
  *list;
  
  this_local = (LadderDatabase *)name._M_str;
  sVar1 = name._M_len;
  index._7_1_ = 0;
  local_30 = in_R8;
  max_local = sVar1;
  name_local._M_len = max;
  name_local._M_str = (char *)this;
  std::
  forward_list<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
  ::forward_list((forward_list<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
                  *)this);
  itr = (Entry *)0x0;
  if (local_30 == 0) {
    for (local_48 = *(Entry **)(sVar1 + 0x50); local_48 != (Entry *)0x0; local_48 = local_48->next)
    {
      rhs._M_str = (char *)max;
      rhs._M_len = name_local._M_len;
      sVar1 = jessilib::findi<char,char>
                        ((jessilib *)&local_48->most_recent_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_local,rhs);
      if (sVar1 != 0xffffffffffffffff) {
        std::
        forward_list<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
        ::emplace_front<RenX::LadderDatabase::Entry&,unsigned_long&>
                  ((forward_list<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
                    *)this,local_48,(unsigned_long *)&itr);
      }
      itr = (Entry *)((long)&itr->rank + 1);
    }
  }
  else {
    for (local_70 = *(Entry **)(sVar1 + 0x50); local_70 != (Entry *)0x0; local_70 = local_70->next)
    {
      rhs_00._M_str = (char *)max;
      rhs_00._M_len = name_local._M_len;
      sVar1 = jessilib::findi<char,char>
                        ((jessilib *)&local_70->most_recent_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_local,rhs_00);
      if (sVar1 != 0xffffffffffffffff) {
        std::
        forward_list<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
        ::emplace_front<RenX::LadderDatabase::Entry&,unsigned_long&>
                  ((forward_list<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
                    *)this,local_70,(unsigned_long *)&itr);
        if (local_30 != 1) {
          return (_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
                  )(_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
                    )this;
        }
        local_30 = 0;
      }
      itr = (Entry *)((long)&itr->rank + 1);
    }
  }
  return (_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
          )(_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
            )this;
}

Assistant:

std::forward_list<std::pair<RenX::LadderDatabase::Entry, size_t>> RenX::LadderDatabase::getPlayerEntriesAndIndexByPartName(std::string_view name, size_t max) const {
	std::forward_list<std::pair<Entry, size_t>> list;
	size_t index = 0;
	if (max == 0)
	{
		for (Entry *itr = m_head; itr != nullptr; itr = itr->next, ++index) {
			if (jessilib::findi(itr->most_recent_name, name) != std::string::npos) {
				list.emplace_front(*itr, index);
			}
		}
	}
	else {
		for (Entry* itr = m_head; itr != nullptr; itr = itr->next, ++index) {
			if (jessilib::findi(itr->most_recent_name, name) != std::string::npos) {
				list.emplace_front(*itr, index);
				if (--max) {
					return list;
				}
			}
		}
	}
	return list;
}